

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplicialCholesky_impl.h
# Opt level: O3

void __thiscall
Eigen::
SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
::analyzePattern_preordered
          (SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
           *this,CholMatrixType *ap,bool doLDLT)

{
  int *piVar1;
  int *piVar2;
  StorageIndex *pSVar3;
  StorageIndex *pSVar4;
  CholMatrixType *pCVar5;
  SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
  *pSVar6;
  long lVar7;
  int *piVar8;
  undefined1 *__ptr;
  StorageIndex *pSVar9;
  undefined8 *puVar10;
  undefined7 in_register_00000011;
  uint uVar11;
  CholMatrixType **ppCVar12;
  int iVar13;
  size_t __size;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  uint *puVar17;
  long lVar18;
  CholMatrixType *local_58;
  size_t local_50;
  undefined4 local_44;
  SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
  *local_40;
  ulong local_38;
  
  ppCVar12 = &local_58;
  local_44 = (undefined4)CONCAT71(in_register_00000011,doLDLT);
  lVar7 = ap->m_innerSize << 0x20;
  uVar11 = (uint)ap->m_innerSize;
  uVar16 = (ulong)(int)uVar11;
  local_58 = ap;
  SparseMatrix<double,_0,_int>::resize(&this->m_matrix,uVar16,uVar16);
  local_40 = this;
  local_38 = uVar16;
  __size = lVar7 >> 0x1e;
  if ((this->m_parent).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != uVar16) {
    free((this->m_parent).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    if (lVar7 == 0) {
      piVar8 = (int *)0x0;
    }
    else if ((0x3fffffffffffffff < local_38) ||
            (piVar8 = (int *)malloc(__size), piVar8 == (int *)0x0)) goto LAB_00140b38;
    (local_40->m_parent).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = piVar8;
  }
  (local_40->m_parent).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = local_38;
  if ((local_40->m_nonZerosPerCol).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows == local_38) {
    if (0x3fffffffffffffff < local_38) goto LAB_00140b38;
  }
  else {
    free((local_40->m_nonZerosPerCol).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
         m_storage.m_data);
    if (lVar7 == 0) {
      piVar8 = (int *)0x0;
    }
    else if ((0x3fffffffffffffff < local_38) ||
            (piVar8 = (int *)malloc(__size), piVar8 == (int *)0x0)) goto LAB_00140b38;
    (local_40->m_nonZerosPerCol).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
    m_storage.m_data = piVar8;
    (local_40->m_nonZerosPerCol).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
    m_storage.m_rows = local_38;
  }
  local_50 = __size;
  if (__size < 0x20001) {
    ppCVar12 = (CholMatrixType **)((long)&local_58 - (__size + 0x1e & 0xfffffffffffffff0));
    __ptr = (undefined1 *)ppCVar12;
  }
  else {
    __ptr = (undefined1 *)malloc(__size);
    if (__ptr == (undefined1 *)0x0) {
LAB_00140b38:
      puVar10 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar10 = std::streambuf::xsgetn;
      __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  if ((int)uVar11 < 1) {
    pSVar9 = (local_40->m_matrix).m_outerIndex;
    *pSVar9 = 0;
  }
  else {
    piVar8 = (local_40->m_parent).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    piVar2 = (local_40->m_nonZerosPerCol).
             super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    pSVar3 = (local_58->m_data).m_indices;
    pSVar9 = local_58->m_outerIndex;
    pSVar4 = local_58->m_innerNonZeros;
    uVar16 = 0;
    do {
      piVar8[uVar16] = -1;
      uVar14 = (uint)uVar16;
      *(uint *)(__ptr + uVar16 * 4) = uVar14;
      piVar2[uVar16] = 0;
      lVar7 = (long)pSVar9[uVar16];
      if (pSVar4 == (StorageIndex *)0x0) {
        lVar15 = (long)pSVar9[uVar16 + 1];
      }
      else {
        lVar15 = pSVar4[uVar16] + lVar7;
      }
      if (lVar7 < lVar15) {
        do {
          lVar18 = (long)pSVar3[lVar7];
          if ((lVar18 < (long)uVar16) && (uVar16 != *(uint *)(__ptr + lVar18 * 4))) {
            puVar17 = (uint *)(__ptr + lVar18 * 4);
            do {
              if (piVar8[lVar18] == -1) {
                piVar8[lVar18] = uVar14;
              }
              piVar1 = piVar2 + lVar18;
              *piVar1 = *piVar1 + 1;
              *puVar17 = uVar14;
              lVar18 = (long)piVar8[lVar18];
              puVar17 = (uint *)(__ptr + lVar18 * 4);
            } while (uVar16 != *puVar17);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != lVar15);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != (uVar11 & 0x7fffffff));
    pSVar9 = (local_40->m_matrix).m_outerIndex;
    *pSVar9 = 0;
    if (0 < (int)uVar11) {
      piVar8 = (local_40->m_nonZerosPerCol).
               super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      iVar13 = 0;
      uVar16 = 0;
      do {
        iVar13 = iVar13 + (uint)(byte)((byte)local_44 ^ 1) + piVar8[uVar16];
        pSVar9[uVar16 + 1] = iVar13;
        uVar16 = uVar16 + 1;
      } while ((uVar11 & 0x7fffffff) != uVar16);
    }
  }
  pSVar6 = local_40;
  iVar13 = pSVar9[local_38];
  pCVar5 = &local_40->m_matrix;
  *(undefined8 *)((long)ppCVar12 + -8) = 0x140b04;
  internal::CompressedStorage<double,_int>::resize(&pCVar5->m_data,(long)iVar13,0.0);
  (pSVar6->
  super_SparseSolverBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
  ).m_isInitialized = true;
  pSVar6->m_info = Success;
  pSVar6->m_factorizationIsOk = false;
  pSVar6->m_analysisIsOk = true;
  if (0x20000 < local_50) {
    *(undefined8 *)((long)ppCVar12 + -8) = 0x140b29;
    free(__ptr);
  }
  return;
}

Assistant:

void SimplicialCholeskyBase<Derived>::analyzePattern_preordered(const CholMatrixType& ap, bool doLDLT)
{
  const StorageIndex size = StorageIndex(ap.rows());
  m_matrix.resize(size, size);
  m_parent.resize(size);
  m_nonZerosPerCol.resize(size);

  ei_declare_aligned_stack_constructed_variable(StorageIndex, tags, size, 0);

  for(StorageIndex k = 0; k < size; ++k)
  {
    /* L(k,:) pattern: all nodes reachable in etree from nz in A(0:k-1,k) */
    m_parent[k] = -1;             /* parent of k is not yet known */
    tags[k] = k;                  /* mark node k as visited */
    m_nonZerosPerCol[k] = 0;      /* count of nonzeros in column k of L */
    for(typename CholMatrixType::InnerIterator it(ap,k); it; ++it)
    {
      StorageIndex i = it.index();
      if(i < k)
      {
        /* follow path from i to root of etree, stop at flagged node */
        for(; tags[i] != k; i = m_parent[i])
        {
          /* find parent of i if not yet determined */
          if (m_parent[i] == -1)
            m_parent[i] = k;
          m_nonZerosPerCol[i]++;        /* L (k,i) is nonzero */
          tags[i] = k;                  /* mark i as visited */
        }
      }
    }
  }

  /* construct Lp index array from m_nonZerosPerCol column counts */
  StorageIndex* Lp = m_matrix.outerIndexPtr();
  Lp[0] = 0;
  for(StorageIndex k = 0; k < size; ++k)
    Lp[k+1] = Lp[k] + m_nonZerosPerCol[k] + (doLDLT ? 0 : 1);

  m_matrix.resizeNonZeros(Lp[size]);

  m_isInitialized     = true;
  m_info              = Success;
  m_analysisIsOk      = true;
  m_factorizationIsOk = false;
}